

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.cpp
# Opt level: O3

void __thiscall llama_model_loader::print_info(llama_model_loader *this)

{
  ulong uVar1;
  uint uVar2;
  char *pcVar3;
  double dVar4;
  undefined1 auVar5 [16];
  double dVar6;
  string local_38;
  
  uVar2 = this->fver - GGUF_FILE_VERSION_V1;
  if (uVar2 < 3) {
    pcVar3 = (&PTR_anon_var_dwarf_17b930_00286040)[uVar2];
  }
  else {
    pcVar3 = "unknown";
  }
  llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: file format = %s\n","print_info",pcVar3);
  llama_model_ftype_name_abi_cxx11_(&local_38,this->ftype);
  llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: file type   = %s\n","print_info",
                     local_38._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  uVar1 = this->n_bytes;
  auVar5._8_4_ = (int)(uVar1 >> 0x20);
  auVar5._0_8_ = uVar1;
  auVar5._12_4_ = 0x45300000;
  dVar6 = (auVar5._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
  dVar4 = dVar6 * 0.0009765625 * 0.0009765625;
  if (uVar1 < 0x40000000) {
    dVar6 = (dVar6 * 8.0) /
            (((double)CONCAT44(0x45300000,(int)(this->n_elements >> 0x20)) - 1.9342813113834067e+25)
            + ((double)CONCAT44(0x43300000,(int)this->n_elements) - 4503599627370496.0));
    pcVar3 = "%s: file size   = %.2f MiB (%.2f BPW) \n";
  }
  else {
    dVar4 = dVar4 * 0.0009765625;
    dVar6 = (dVar6 * 8.0) /
            (((double)CONCAT44(0x45300000,(int)(this->n_elements >> 0x20)) - 1.9342813113834067e+25)
            + ((double)CONCAT44(0x43300000,(int)this->n_elements) - 4503599627370496.0));
    pcVar3 = "%s: file size   = %.2f GiB (%.2f BPW) \n";
  }
  llama_log_internal(GGML_LOG_LEVEL_INFO,pcVar3,dVar4,dVar6,"print_info");
  return;
}

Assistant:

void llama_model_loader::print_info() const {
    LLAMA_LOG_INFO("%s: file format = %s\n", __func__, llama_file_version_name(fver));
    LLAMA_LOG_INFO("%s: file type   = %s\n", __func__, llama_model_ftype_name(ftype).c_str());
    if (n_bytes < GiB) {
        LLAMA_LOG_INFO("%s: file size   = %.2f MiB (%.2f BPW) \n", __func__, n_bytes/1024.0/1024.0,        n_bytes*8.0/n_elements);
    } else {
        LLAMA_LOG_INFO("%s: file size   = %.2f GiB (%.2f BPW) \n", __func__, n_bytes/1024.0/1024.0/1024.0, n_bytes*8.0/n_elements);
    }
}